

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_header.c
# Opt level: O0

void cmime_header_set_value(CMimeHeader_T *header,char *value,int overwrite)

{
  char **ppcVar1;
  char *pcVar2;
  ulong local_30;
  size_t i;
  char **tmp;
  int overwrite_local;
  char *value_local;
  CMimeHeader_T *header_local;
  
  if (header != (CMimeHeader_T *)0x0) {
    if (overwrite == 1) {
      for (local_30 = 0; local_30 < header->count; local_30 = local_30 + 1) {
        if (header->value[local_30] != (char *)0x0) {
          free(header->value[local_30]);
        }
      }
      header->count = 0;
    }
    ppcVar1 = (char **)realloc(header->value,(header->count + 1) * 8);
    if (value == (char *)0x0) {
      ppcVar1[header->count] = (char *)0x0;
    }
    else {
      pcVar2 = strdup(value);
      ppcVar1[header->count] = pcVar2;
    }
    header->value = ppcVar1;
    header->count = header->count + 1;
    return;
  }
  __assert_fail("header",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_header.c"
                ,0x44,"void cmime_header_set_value(CMimeHeader_T *, const char *, int)");
}

Assistant:

void cmime_header_set_value(CMimeHeader_T *header, const char *value, int overwrite) {
    char **tmp = NULL;
    size_t i;
    assert(header);

    if (overwrite==1) {
        for(i = 0; i < header->count; i++) {
            if (header->value[i] != NULL) 
                free(header->value[i]);
        }
        header->count = 0;
    }

    tmp = realloc(header->value, (sizeof( *tmp) * (header->count+1)));
    if (value != NULL)
        tmp[header->count] = strdup(value);
    else 
        tmp[header->count] = NULL;
    header->value = tmp;
    
    header->count++;
}